

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::text_format_unittest::TextFormatTest_FieldsPopulatedCorrectly_Test::TestBody
          (TextFormatTest_FieldsPopulatedCorrectly_Test *this)

{
  bool bVar1;
  TestAllTypes *pTVar2;
  pointer *__ptr;
  char *pcVar3;
  char *in_R9;
  pointer *__ptr_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aVar4;
  string_view input;
  string_view input_00;
  string_view input_01;
  string_view input_02;
  string_view field;
  string_view field_00;
  string_view field_01;
  string_view field_02;
  string_view field_03;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_1;
  UnsetFieldsMetadata no_op_fields;
  Parser parser;
  TestAllTypes proto;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_368;
  undefined1 local_360 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_358;
  AssertHelper local_350;
  undefined1 local_348 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  UnsetFieldsMetadata local_328;
  Parser local_308;
  TestAllTypes local_2d8;
  
  proto3_unittest::TestAllTypes::TestAllTypes(&local_2d8,(Arena *)0x0);
  TextFormat::Parser::Parser(&local_308);
  local_308.no_op_fields_ = &local_328;
  local_328.ids_.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       1;
  local_328.ids_.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  local_338 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               )ZEXT816(0);
  _local_348 = (Id)ZEXT816(1);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
  ::assign_impl<true>((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                       *)local_308.no_op_fields_,
                      (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                       *)local_348);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
  ::destructor_impl((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                     *)local_348);
  pTVar2 = &local_2d8;
  input._M_str = 
  "\n      optional_int32: 0\n      optional_uint32: 10\n      optional_nested_message { bb: 0 }\n    "
  ;
  input._M_len = 0x5f;
  bVar1 = TextFormat::Parser::ParseFromString(&local_308,input,&pTVar2->super_Message);
  local_360[0] = (internal)bVar1;
  local_358 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_368);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_348,(internal *)local_360,
               (AssertionResult *)"parser.ParseFromString(parse_string, &proto)","false","true",
               in_R9);
    pTVar2 = (TestAllTypes *)0x4b4;
    testing::internal::AssertHelper::AssertHelper
              (&local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
               ,0x4b4,(char *)local_348);
    testing::internal::AssertHelper::operator=(&local_350,(Message *)&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_350);
    if (local_348 != (undefined1  [8])&local_338) {
      operator_delete((void *)local_348,(ulong)(local_338._M_allocated_capacity + 1));
    }
    if (local_368._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_368._M_head_impl + 8))();
    }
  }
  if (local_358 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_360 + 8),local_358);
  }
  field._M_str = (char *)pTVar2;
  field._M_len = (size_t)"optional_int32";
  aVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           )protobuf::internal::UnsetFieldsMetadataTextFormatTestUtil::GetId
                      ((UnsetFieldsMetadataTextFormatTestUtil *)&local_2d8,(Message *)0xe,field);
  if (local_2d8.field_0._impl_.optional_nested_message_ == (TestAllTypes_NestedMessage *)0x0) {
    local_2d8.field_0._impl_.optional_nested_message_ =
         (TestAllTypes_NestedMessage *)
         proto3_unittest::_TestAllTypes_NestedMessage_default_instance_;
  }
  field_00._M_str = (char *)pTVar2;
  field_00._M_len = (size_t)"bb";
  _local_348 = protobuf::internal::UnsetFieldsMetadataTextFormatTestUtil::GetId
                         ((UnsetFieldsMetadataTextFormatTestUtil *)
                          local_2d8.field_0._impl_.optional_nested_message_,(Message *)0x2,field_00)
  ;
  local_338 = aVar4;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>,std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>>
  ::operator()(local_360,local_348,
               (flat_hash_set<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                *)"Peer::GetRawIds(no_op_fields)");
  if (local_360[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_348);
    if (local_358 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = *(char **)local_358;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
               ,0x4b8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_368,(Message *)local_348);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_368);
    if (local_348 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_348 + 8))();
    }
  }
  if (local_358 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_360 + 8),local_358);
  }
  local_338 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               )ZEXT816(0);
  _local_348 = (Id)ZEXT816(1);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
  ::assign_impl<true>((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                       *)&local_328,
                      (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                       *)local_348);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
  ::destructor_impl((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                     *)local_348);
  pTVar2 = &local_2d8;
  input_00._M_str =
       "\n      optional_bool: false\n      optional_uint32: 10\n      optional_nested_message { bb: 20 }\n    "
  ;
  input_00._M_len = 99;
  bVar1 = TextFormat::Parser::ParseFromString(&local_308,input_00,&pTVar2->super_Message);
  local_360[0] = (internal)bVar1;
  local_358 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_368);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_348,(internal *)local_360,
               (AssertionResult *)"parser.ParseFromString(parse_string, &proto)","false","true",
               in_R9);
    pTVar2 = (TestAllTypes *)0x4c1;
    testing::internal::AssertHelper::AssertHelper
              (&local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
               ,0x4c1,(char *)local_348);
    testing::internal::AssertHelper::operator=(&local_350,(Message *)&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_350);
    if (local_348 != (undefined1  [8])&local_338) {
      operator_delete((void *)local_348,(ulong)(local_338._M_allocated_capacity + 1));
    }
    if (local_368._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_368._M_head_impl + 8))();
    }
  }
  if (local_358 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_360 + 8),local_358);
  }
  field_01._M_str = (char *)pTVar2;
  field_01._M_len = (size_t)"optional_bool";
  _local_360 = protobuf::internal::UnsetFieldsMetadataTextFormatTestUtil::GetId
                         ((UnsetFieldsMetadataTextFormatTestUtil *)&local_2d8,
                          (Message *)&DAT_0000000d,field_01);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>>
  ::operator()(local_348,local_360,
               (flat_hash_set<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                *)"Peer::GetRawIds(no_op_fields)");
  if (local_348[0] == '\0') {
    testing::Message::Message((Message *)local_360);
    if (pbStack_340 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = *(char **)pbStack_340;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
               ,0x4c3,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_368,(Message *)local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_368);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_360 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_360 + 8))();
    }
  }
  if (pbStack_340 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_348 + 8),pbStack_340);
  }
  local_338 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               )ZEXT816(0);
  _local_348 = (Id)ZEXT816(1);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
  ::assign_impl<true>((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                       *)&local_328,
                      (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                       *)local_348);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
  ::destructor_impl((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                     *)local_348);
  pTVar2 = &local_2d8;
  input_01._M_str = "optional_string: \"\"";
  input_01._M_len = 0x13;
  bVar1 = TextFormat::Parser::ParseFromString(&local_308,input_01,&pTVar2->super_Message);
  local_360[0] = (internal)bVar1;
  local_358 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_368);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_348,(internal *)local_360,
               (AssertionResult *)"parser.ParseFromString(parse_string, &proto)","false","true",
               in_R9);
    pTVar2 = (TestAllTypes *)0x4ca;
    testing::internal::AssertHelper::AssertHelper
              (&local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
               ,0x4ca,(char *)local_348);
    testing::internal::AssertHelper::operator=(&local_350,(Message *)&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_350);
    if (local_348 != (undefined1  [8])&local_338) {
      operator_delete((void *)local_348,(ulong)(local_338._M_allocated_capacity + 1));
    }
    if (local_368._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_368._M_head_impl + 8))();
    }
  }
  if (local_358 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_360 + 8),local_358);
  }
  field_02._M_str = (char *)pTVar2;
  field_02._M_len = (size_t)"optional_string";
  _local_360 = protobuf::internal::UnsetFieldsMetadataTextFormatTestUtil::GetId
                         ((UnsetFieldsMetadataTextFormatTestUtil *)&local_2d8,
                          (Message *)&DAT_0000000f,field_02);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>>
  ::operator()(local_348,local_360,
               (flat_hash_set<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                *)"Peer::GetRawIds(no_op_fields)");
  if (local_348[0] == '\0') {
    testing::Message::Message((Message *)local_360);
    if (pbStack_340 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = *(char **)pbStack_340;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
               ,0x4cc,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_368,(Message *)local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_368);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_360 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_360 + 8))();
    }
  }
  if (pbStack_340 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_348 + 8),pbStack_340);
  }
  local_338 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               )ZEXT816(0);
  _local_348 = (Id)ZEXT816(1);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
  ::assign_impl<true>((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                       *)&local_328,
                      (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                       *)local_348);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
  ::destructor_impl((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                     *)local_348);
  pTVar2 = &local_2d8;
  input_02._M_str = "optional_bytes: \"\"";
  input_02._M_len = 0x12;
  bVar1 = TextFormat::Parser::ParseFromString(&local_308,input_02,&pTVar2->super_Message);
  local_360[0] = (internal)bVar1;
  local_358 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_368);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_348,(internal *)local_360,
               (AssertionResult *)"parser.ParseFromString(parse_string, &proto)","false","true",
               in_R9);
    pTVar2 = (TestAllTypes *)0x4d3;
    testing::internal::AssertHelper::AssertHelper
              (&local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
               ,0x4d3,(char *)local_348);
    testing::internal::AssertHelper::operator=(&local_350,(Message *)&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_350);
    if (local_348 != (undefined1  [8])&local_338) {
      operator_delete((void *)local_348,(ulong)(local_338._M_allocated_capacity + 1));
    }
    if (local_368._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_368._M_head_impl + 8))();
    }
  }
  if (local_358 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_360 + 8),local_358);
  }
  field_03._M_str = (char *)pTVar2;
  field_03._M_len = (size_t)"optional_bytes";
  _local_360 = protobuf::internal::UnsetFieldsMetadataTextFormatTestUtil::GetId
                         ((UnsetFieldsMetadataTextFormatTestUtil *)&local_2d8,(Message *)0xe,
                          field_03);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>>
  ::operator()(local_348,local_360,
               (flat_hash_set<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                *)"Peer::GetRawIds(no_op_fields)");
  if (local_348[0] == '\0') {
    testing::Message::Message((Message *)local_360);
    if (pbStack_340 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = *(char **)pbStack_340;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
               ,0x4d5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_368,(Message *)local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_368);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_360 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_360 + 8))();
    }
  }
  if (pbStack_340 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_348 + 8),pbStack_340);
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
  ::destructor_impl((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                     *)&local_328);
  TextFormat::Parser::~Parser(&local_308);
  proto3_unittest::TestAllTypes::~TestAllTypes(&local_2d8);
  return;
}

Assistant:

TEST_F(TextFormatTest, FieldsPopulatedCorrectly) {
  using Peer = UnsetFieldsMetadataTextFormatTestUtil;
  proto3_unittest::TestAllTypes proto;
  TextFormat::Parser parser;
  TextFormat::Parser::UnsetFieldsMetadata no_op_fields;
  parser.OutputNoOpFields(&no_op_fields);
  {
    no_op_fields = {};
    const absl::string_view parse_string = R"pb(
      optional_int32: 0
      optional_uint32: 10
      optional_nested_message { bb: 0 }
    )pb";
    EXPECT_TRUE(parser.ParseFromString(parse_string, &proto));
    EXPECT_THAT(Peer::GetRawIds(no_op_fields),
                UnorderedElementsAre(
                    Peer::GetId(proto, "optional_int32"),
                    Peer::GetId(proto.optional_nested_message(), "bb")));
  }
  {
    no_op_fields = {};
    const absl::string_view parse_string = R"pb(
      optional_bool: false
      optional_uint32: 10
      optional_nested_message { bb: 20 }
    )pb";
    EXPECT_TRUE(parser.ParseFromString(parse_string, &proto));
    EXPECT_THAT(Peer::GetRawIds(no_op_fields),
                UnorderedElementsAre(Peer::GetId(proto, "optional_bool")));
  }
  {
    // The address returned by the field is a string_view, which is a separate
    // allocation. Check address directly.
    no_op_fields = {};
    const absl::string_view parse_string = "optional_string: \"\"";
    EXPECT_TRUE(parser.ParseFromString(parse_string, &proto));
    EXPECT_THAT(Peer::GetRawIds(no_op_fields),
                UnorderedElementsAre(Peer::GetId(proto, "optional_string")));
  }
  {
    // The address returned by the field is a string_view, which is a separate
    // allocation. Check address directly.
    no_op_fields = {};
    const absl::string_view parse_string = "optional_bytes: \"\"";
    EXPECT_TRUE(parser.ParseFromString(parse_string, &proto));
    EXPECT_THAT(Peer::GetRawIds(no_op_fields),
                UnorderedElementsAre(Peer::GetId(proto, "optional_bytes")));
  }
}